

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils-conv.c
# Opt level: O0

char * json_escape(char *src)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  GString *gstring;
  char *pcVar4;
  uint16_t low;
  uint16_t high;
  gunichar c;
  GString *s;
  char *p;
  char *src_local;
  
  sVar3 = strlen(src);
  _low = (GString *)g_string_sized_new(sVar3);
  for (s = (GString *)src; *(char *)&s->str != '\0';
      s = (GString *)((long)&s->str + (long)(int)*(char *)(_g_utf8_skip + (ulong)*(byte *)&s->str)))
  {
    uVar1 = g_utf8_get_char(s);
    switch(uVar1) {
    case 8:
      _low = (GString *)g_string_append(_low);
      break;
    case 9:
      _low = (GString *)g_string_append(_low);
      break;
    case 10:
      _low = (GString *)g_string_append(_low);
      break;
    case 0xb:
      _low = (GString *)g_string_append(_low);
      break;
    case 0xc:
      _low = (GString *)g_string_append(_low);
      break;
    case 0xd:
      _low = (GString *)g_string_append(_low);
      break;
    default:
      iVar2 = g_unichar_isgraph(uVar1);
      if ((iVar2 == 0) && (uVar1 != 0x20)) {
        if (uVar1 < 0x10000) {
          g_string_append_printf(_low,"\\u%04X",uVar1);
        }
        else {
          g_string_append_printf
                    (_low,"\\u%04X\\u%04X",(short)(uVar1 - 0x10000 >> 10) + -0x2800,
                     ((ushort)uVar1 & 0x3ff) + 0xdc00);
        }
      }
      else {
        _low = (GString *)g_string_append_unichar(_low);
      }
      break;
    case 0x22:
    case 0x27:
    case 0x5c:
      gstring = g_string_append_c_inline(_low,'\\');
      _low = g_string_append_c_inline(gstring,(gchar)uVar1);
      break;
    case 0x2a:
      _low = g_string_append_c_inline(_low,'\\');
    }
  }
  pcVar4 = (char *)g_string_free(_low,0);
  return pcVar4;
}

Assistant:

char *
json_escape (const char *src)
{
    // TODO g_string_replace from glib 2.68 does it all

    char *p = (char *) src;
    GString *s = g_string_sized_new (strlen (src));

    while (*p) {
        gunichar c = g_utf8_get_char (p);
        switch (c)
        {
        // JSON does not need to escape asterisk. This is for
        // workaround in format template
        case '*' : s = g_string_append_c (s, '\\'); break;
        case '\\':
        // For all other chars below, they are actually disallowed
        // in Windows path. This is for the mischievous who
        // move data to other OS and rename
        case 0x22:
        case 0x27:
            s = g_string_append_c (s, '\\');
            s = g_string_append_c (s, c);
            break;
        case 0x08: s = g_string_append (s, "\\b"); break;
        case 0x09: s = g_string_append (s, "\\t"); break;
        case 0x0A: s = g_string_append (s, "\\n"); break;
        case 0x0B: s = g_string_append (s, "\\v"); break;
        case 0x0C: s = g_string_append (s, "\\f"); break;
        case 0x0D: s = g_string_append (s, "\\r"); break;
        default  :
            if (g_unichar_isgraph (c) || c == 0x20)
                s = g_string_append_unichar (s, c);
            else if (c < 0x10000)
                g_string_append_printf (s, "\\u%04X", c);
            else  // calculate surrogate
            {
                uint16_t high, low;
                high = 0xD800 + ((c - 0x10000) >> 10  );
                low  = 0xDC00 + ((c - 0x10000) & 0x3FF);
                g_string_append_printf (s, "\\u%04X\\u%04X", high, low);
            }
            break;
        }
        p = g_utf8_next_char (p);
    }
    return g_string_free (s, FALSE);
}